

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::LabeledActions::add
          (LabeledActions *this,string *label,
          MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> *action)

{
  std::__cxx11::string::_M_assign((string *)(this->m_actions + this->m_numActions));
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  operator=(&this->m_actions[this->m_numActions].action,action);
  this->m_numActions = this->m_numActions + 1;
  return;
}

Assistant:

void LabeledActions::add (const string& label, MovePtr<Action> action)
{
	DE_ASSERT(m_numActions < DE_LENGTH_OF_ARRAY(m_actions));
	m_actions[m_numActions].label = label;
	m_actions[m_numActions].action = action;
	++m_numActions;
}